

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O1

void __thiscall
cmQtAutoGenGlobalInitializer::GetOrCreateGlobalTarget
          (cmQtAutoGenGlobalInitializer *this,cmLocalGenerator *localGen,string *name,
          string *comment)

{
  pointer pbVar1;
  cmMakefile *this_00;
  cmGeneratorTarget *pcVar2;
  string *psVar3;
  cmTarget *t;
  cmState *this_01;
  char *value;
  undefined1 local_78 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined8 local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  pcVar2 = cmLocalGenerator::FindGeneratorTargetToUse(localGen,name);
  if (pcVar2 == (cmGeneratorTarget *)0x0) {
    this_00 = localGen->Makefile;
    psVar3 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(this_00);
    local_78._16_8_ = (pointer)0x0;
    local_78._0_8_ = (pointer)0x0;
    local_78._8_8_ = (pointer)0x0;
    local_38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48 = 0;
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    t = cmMakefile::AddUtilityCommand
                  (this_00,name,Generator,true,(psVar3->_M_dataplus)._M_p,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78,&local_38,(cmCustomCommandLines *)&local_58,false,
                   (comment->_M_dataplus)._M_p,false,false);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
              ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)&local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_78);
    pcVar2 = (cmGeneratorTarget *)operator_new(0x5a8);
    cmGeneratorTarget::cmGeneratorTarget(pcVar2,t,localGen);
    cmLocalGenerator::AddGeneratorTarget(localGen,pcVar2);
    this_01 = cmMakefile::GetState(this_00);
    pbVar1 = (pointer)(local_78 + 0x10);
    local_78._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"AUTOGEN_TARGETS_FOLDER","");
    value = cmState::GetGlobalProperty(this_01,(string *)local_78);
    if ((pointer)local_78._0_8_ != pbVar1) {
      operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
    }
    if (value != (char *)0x0) {
      local_78._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"FOLDER","");
      cmTarget::SetProperty(t,(string *)local_78,value);
      if ((pointer)local_78._0_8_ != pbVar1) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
      }
    }
  }
  return;
}

Assistant:

void cmQtAutoGenGlobalInitializer::GetOrCreateGlobalTarget(
  cmLocalGenerator* localGen, std::string const& name,
  std::string const& comment)
{
  // Test if the target already exists
  if (localGen->FindGeneratorTargetToUse(name) == nullptr) {
    cmMakefile* makefile = localGen->GetMakefile();

    // Create utility target
    cmTarget* target = makefile->AddUtilityCommand(
      name, cmMakefile::TargetOrigin::Generator, true,
      makefile->GetHomeOutputDirectory().c_str() /*work dir*/,
      std::vector<std::string>() /*output*/,
      std::vector<std::string>() /*depends*/, cmCustomCommandLines(), false,
      comment.c_str());
    localGen->AddGeneratorTarget(new cmGeneratorTarget(target, localGen));

    // Set FOLDER property in the target
    {
      char const* folder =
        makefile->GetState()->GetGlobalProperty("AUTOGEN_TARGETS_FOLDER");
      if (folder != nullptr) {
        target->SetProperty("FOLDER", folder);
      }
    }
  }
}